

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_data.c
# Opt level: O1

void release_unicode_data(unicode_data_t *ud)

{
  long lVar1;
  ulong uVar2;
  
  if (ud->size != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      free(*(void **)(ud->records->general_category + lVar1 + -8));
      free(*(void **)(ud->records->bidi_class + lVar1 + 8));
      free(*(void **)(ud->records->bidi_class + lVar1 + 0x18));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x58;
    } while (uVar2 < ud->size);
  }
  free(ud->records);
  free(ud);
  return;
}

Assistant:

void release_unicode_data( struct unicode_data_t * ud )
{
    size_t i;

    for ( i = 0; i < ud->size; ++i )
    {
        free( ud->records[i].name );
        free( ud->records[i].decomposition );
        free( ud->records[i].numeric_value );
    }

    free( ud->records );
    free( ud );
}